

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<unsigned_short>(void)

{
  int iVar1;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff40;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_32;
  unsigned_short local_30;
  unsigned_short local_2e;
  unsigned_short local_2c;
  unsigned_short local_2a;
  unsigned_short local_28;
  unsigned_short local_26;
  unsigned_short local_24;
  unsigned_short local_22;
  unsigned_short local_20;
  unsigned_short local_1e;
  unsigned_short local_1c;
  unsigned_short local_1a;
  unsigned_short local_18;
  unsigned_short local_16;
  unsigned_short local_2;
  
  if (ConstCastTestT<unsigned_short>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::b);
    if (iVar1 != 0) {
      local_2 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::b = ::SafeInt::operator_cast_to_bool((SafeInt *)&local_2);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::b);
    }
  }
  if (ConstCastTestT<unsigned_short>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::w);
    if (iVar1 != 0) {
      local_16 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::w =
           ::SafeInt::operator_cast_to_wchar_t(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::w);
    }
  }
  if (ConstCastTestT<unsigned_short>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::c);
    if (iVar1 != 0) {
      local_18 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::c =
           ::SafeInt::operator_cast_to_char(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::c);
    }
  }
  if (ConstCastTestT<unsigned_short>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::sc);
    if (iVar1 != 0) {
      local_1a = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::sc =
           ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_short>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::uc);
    if (iVar1 != 0) {
      local_1c = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::uc =
           ::SafeInt::operator_cast_to_unsigned_char(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_short>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::s);
    if (iVar1 != 0) {
      local_1e = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::s =
           ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::s);
    }
  }
  if (ConstCastTestT<unsigned_short>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::us);
    if (iVar1 != 0) {
      local_20 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::us =
           ::SafeInt::operator_cast_to_unsigned_short(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::us);
    }
  }
  if (ConstCastTestT<unsigned_short>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::i);
    if (iVar1 != 0) {
      local_22 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::i = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff40)
      ;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::i);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ui);
    if (iVar1 != 0) {
      local_24 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ui =
           ::SafeInt::operator_cast_to_unsigned_int(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_short>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::l);
    if (iVar1 != 0) {
      local_26 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::l =
           ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::l);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ul);
    if (iVar1 != 0) {
      local_28 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ul =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ll);
    if (iVar1 != 0) {
      local_2a = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ll =
           ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ull);
    if (iVar1 != 0) {
      local_2c = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_short>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::st);
    if (iVar1 != 0) {
      local_2e = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::st =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::st);
    }
  }
  if (ConstCastTestT<unsigned_short>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::pt);
    if (iVar1 != 0) {
      local_30 = (unsigned_short)ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::pt =
           ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff40);
      in_stack_ffffffffffffff40 =
           (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)ConstCastTestT<unsigned_short>::pt;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_short>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::pl);
    if (iVar1 != 0) {
      local_32 = ConstSafeInt<unsigned_short>();
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::operator+(&local_32);
      ConstCastTestT<unsigned_short>::pl =
           ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff40);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}